

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

edata_t * duckdb_je_edata_heap_any(edata_heap_t *ph)

{
  edata_t *peVar1;
  edata_t *peVar2;
  
  peVar1 = (edata_t *)(ph->ph).root;
  if (peVar1 != (edata_t *)0x0) {
    peVar2 = (peVar1->field_5).ql_link_active.qre_prev;
    if (peVar2 == (edata_t *)0x0) {
      peVar2 = peVar1;
    }
    return peVar2;
  }
  return (edata_t *)0x0;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_any(ph_t *ph, size_t offset) {
	if (ph->root == NULL) {
		return NULL;
	}
	void *aux = phn_next_get(ph->root, offset);
	if (aux != NULL) {
		return aux;
	}
	return ph->root;
}